

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_skies.cpp
# Opt level: O1

void __thiscall ASkyPicker::PostBeginPlay(ASkyPicker *this)

{
  int iVar1;
  sector_t *psVar2;
  uint uVar3;
  ASkyViewpoint *actor;
  TActorIterator<ASkyViewpoint> iterator;
  TActorIterator<ASkyViewpoint> local_18;
  
  AActor::PostBeginPlay(&this->super_AActor);
  iVar1 = (this->super_AActor).args[0];
  if (iVar1 == 0) {
    actor = (ASkyViewpoint *)0x0;
  }
  else {
    local_18.super_FActorIterator.base = (AActor *)0x0;
    local_18.super_FActorIterator.id = iVar1;
    actor = TActorIterator<ASkyViewpoint>::Next(&local_18);
  }
  if ((actor == (ASkyViewpoint *)0x0) && (uVar3 = (this->super_AActor).args[0], uVar3 != 0)) {
    Printf("Can\'t find SkyViewpoint %d for sector %td\n",(ulong)uVar3,
           ((long)(this->super_AActor).Sector - (long)sectors >> 3) * -0xf4898d5f85bb395);
  }
  else {
    uVar3 = P_GetSkyboxPortal(actor);
    if ((((this->super_AActor).args[1] & 2) == 0) &&
       (psVar2 = (this->super_AActor).Sector, sectorPortals.Array[psVar2->Portals[1]].mType == 0)) {
      psVar2->Portals[1] = uVar3;
    }
    if ((((this->super_AActor).args[1] & 1) == 0) &&
       (psVar2 = (this->super_AActor).Sector, sectorPortals.Array[psVar2->Portals[0]].mType == 0)) {
      psVar2->Portals[0] = uVar3;
    }
  }
  (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void ASkyPicker::PostBeginPlay ()
{
	ASkyViewpoint *box;
	Super::PostBeginPlay ();

	if (args[0] == 0)
	{
		box = NULL;
	}
	else
	{
		TActorIterator<ASkyViewpoint> iterator (args[0]);
		box = iterator.Next ();
	}

	if (box == NULL && args[0] != 0)
	{
		Printf ("Can't find SkyViewpoint %d for sector %td\n", args[0], Sector - sectors);
	}
	else
	{
		int boxindex = P_GetSkyboxPortal(box);
		// Do not override special portal types, only regular skies.
		if (0 == (args[1] & 2))
		{
			if (Sector->GetPortalType(sector_t::ceiling) == PORTS_SKYVIEWPOINT)
				Sector->Portals[sector_t::ceiling] = boxindex;
		}
		if (0 == (args[1] & 1))
		{
			if (Sector->GetPortalType(sector_t::floor) == PORTS_SKYVIEWPOINT)
				Sector->Portals[sector_t::floor] = boxindex;
		}
	}
	Destroy ();
}